

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uecc.c
# Opt level: O2

int lookup_certificate(ptls_lookup_certificate_t *_self,ptls_t *tls,uint16_t *sign_algorithm,
                      _func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t **signer,void **signer_data,
                      ptls_iovec_t **certs,size_t *num_certs,char *server_name,
                      uint16_t *signature_algorithms,size_t num_signature_algorithms)

{
  long lVar1;
  uint16_t uVar2;
  int iVar3;
  
  iVar3 = 0x28;
  if (_self[2].cb !=
      (_func_int_st_ptls_lookup_certificate_t_ptr_ptls_t_ptr_uint16_t_ptr__func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t_ptr_ptr_void_ptr_ptr_ptls_iovec_t_ptr_ptr_size_t_ptr_char_ptr_uint16_t_ptr_size_t
       *)0x0) {
    lVar1 = *(long *)_self[1].cb;
    uVar2 = select_compatible_signature_algorithm
                      (*(EVP_PKEY **)(lVar1 + 0x10),signature_algorithms,num_signature_algorithms);
    *sign_algorithm = uVar2;
    if (uVar2 != 0xffff) {
      *signer = rsapss_sign;
      *signer_data = *(void **)(lVar1 + 0x10);
      *certs = (ptls_iovec_t *)(lVar1 + 0x20);
      *num_certs = *(size_t *)(lVar1 + 0x18);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int lookup_certificate(ptls_lookup_certificate_t *_self, ptls_t *tls, uint16_t *sign_algorithm,
                              int (**signer)(void *sign_ctx, ptls_buffer_t *outbuf, ptls_iovec_t input), void **signer_data,
                              ptls_iovec_t **certs, size_t *num_certs, const char *server_name,
                              const uint16_t *signature_algorithms, size_t num_signature_algorithms)
{
    ptls_minicrypto_lookup_certificate_t *self = (ptls_minicrypto_lookup_certificate_t *)_self;
    struct st_ptls_minicrypto_identity_t *identity;
    size_t i;

    if (self->count == 0)
        return PTLS_ALERT_HANDSHAKE_FAILURE;

    for (i = 0; i != num_signature_algorithms; ++i)
        if (signature_algorithms[i] == PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256)
            goto FoundMatchingSig;
    return PTLS_ALERT_HANDSHAKE_FAILURE;

FoundMatchingSig:
    if (server_name != NULL) {
        size_t server_name_len = strlen(server_name);
        for (i = 0; i != self->count; ++i) {
            identity = self->identities[i];
            if (ascii_streq_caseless(ptls_iovec_init(server_name, server_name_len), identity->name))
                goto FoundIdentity;
        }
    }
    identity = self->identities[0]; /* use default */

FoundIdentity:
    /* setup the rest */
    *sign_algorithm = PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256;
    *signer = secp256r1sha256_sign;
    *signer_data = identity->key;
    *certs = identity->certs;
    *num_certs = identity->num_certs;

    return 0;
}